

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

void __thiscall QAccessibleToolButton::doAction(QAccessibleToolButton *this)

{
  QString *in_stack_00000018;
  QAccessibleToolButton *in_stack_00000020;
  
  doAction(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void QAccessibleToolButton::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == pressAction()) {
        button()->click();
    } else if (actionName == showMenuAction()) {
#if QT_CONFIG(menu)
        if (toolButton()->popupMode() != QToolButton::InstantPopup) {
            toolButton()->setDown(true);
            toolButton()->showMenu();
        }
#endif
    } else {
        QAccessibleButton::doAction(actionName);
    }

}